

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image_test.cc
# Opt level: O3

void __thiscall
AomImageTest_AomImgWrapInvalidAlign_Test::~AomImageTest_AomImgWrapInvalidAlign_Test
          (AomImageTest_AomImgWrapInvalidAlign_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST(AomImageTest, AomImgWrapInvalidAlign) {
  const int kWidth = 128;
  const int kHeight = 128;
  unsigned char buf[kWidth * kHeight * 3];

  aom_image_t img;
  // Set img_data and img_data_owner to junk values. aom_img_wrap() should
  // not read these values on failure.
  img.img_data = (unsigned char *)"";
  img.img_data_owner = 1;

  aom_img_fmt_t format = AOM_IMG_FMT_I444;
  // 'align' must be a power of 2 but is not. This causes the aom_img_wrap()
  // call to fail. The test verifies we do not read the junk values in 'img'.
  unsigned int align = 31;
  EXPECT_EQ(aom_img_wrap(&img, format, kWidth, kHeight, align, buf), nullptr);
}